

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O2

bool __thiscall
QAbstractProxyModel::setHeaderData
          (QAbstractProxyModel *this,int section,Orientation orientation,QVariant *value,int role)

{
  long lVar1;
  long *plVar2;
  undefined1 uVar3;
  undefined4 uVar4;
  long in_FS_OFFSET;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (orientation == Horizontal) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = 0xffffffffffffffff;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = 0;
    uStack_60 = 0;
    (**(code **)(*(long *)this + 0x60))(&local_58,this,0);
    (**(code **)(*(long *)this + 400))(&local_70,this,&local_58);
    uVar4 = local_70._4_4_;
  }
  else {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = 0xffffffffffffffff;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = 0;
    uStack_60 = 0;
    (**(code **)(*(long *)this + 0x60))(&local_58,this,section,0);
    (**(code **)(*(long *)this + 400))(&local_70,this,&local_58);
    uVar4 = (undefined4)local_70;
  }
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  ::value((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           *)(lVar1 + 0xd8));
  plVar2 = *(long **)(lVar1 + 0xd8);
  uVar3 = (**(code **)(*plVar2 + 0xa8))(plVar2,uVar4,orientation,value,role);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractProxyModel::setHeaderData(int section, Qt::Orientation orientation, const QVariant &value, int role)
{
    Q_D(QAbstractProxyModel);
    int sourceSection;
    if (orientation == Qt::Horizontal) {
        const QModelIndex proxyIndex = index(0, section);
        sourceSection = mapToSource(proxyIndex).column();
    } else {
        const QModelIndex proxyIndex = index(section, 0);
        sourceSection = mapToSource(proxyIndex).row();
    }
    return d->model->setHeaderData(sourceSection, orientation, value, role);
}